

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

void Js::InterpreterStackFrame::TraceOpCode(InterpreterStackFrame *that,OpCode op)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  char16 *pcVar8;
  undefined6 in_register_00000032;
  
  piVar1 = (int *)(*(long *)(that + 0x78) + 0xb38 +
                  (CONCAT62(in_register_00000032,op) & 0xffffffff) * 4);
  *piVar1 = *piVar1 + 1;
  uVar6 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(that + 0x88));
  lVar3 = *(long *)(that + 0x88);
  if (*(long *)(lVar3 + 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) goto LAB_0099a0ab;
    *puVar7 = 0;
  }
  bVar5 = Phases::IsEnabled((Phases *)&DAT_015cd718,InterpreterPhase,uVar6,
                            *(LocalFunctionId *)(*(long *)(lVar3 + 0x10) + 0x10));
  if (!bVar5) {
    return;
  }
  uVar6 = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(that + 0x88));
  lVar3 = *(long *)(that + 0x88);
  if (*(long *)(lVar3 + 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) {
LAB_0099a0ab:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar7 = 0;
  }
  uVar2 = *(uint *)(*(long *)(lVar3 + 0x10) + 0x10);
  pcVar8 = OpCodeUtil::GetOpCodeName(op);
  Output::Print(L"%d.%d:Executing %s at offset 0x%X\n",(ulong)uVar6,(ulong)uVar2,pcVar8,
                *(undefined8 *)(that + 0x108));
  return;
}

Assistant:

void InterpreterStackFrame::TraceOpCode(InterpreterStackFrame* that, Js::OpCode op)
    {
#if DBG_DUMP
        that->scriptContext->byteCodeHistogram[(int)op]++;
        if (PHASE_TRACE(Js::InterpreterPhase, that->m_functionBody))
        {
            Output::Print(_u("%d.%d:Executing %s at offset 0x%X\n"), that->m_functionBody->GetSourceContextId(), that->m_functionBody->GetLocalFunctionId(), Js::OpCodeUtil::GetOpCodeName(op), that->DEBUG_currentByteOffset);
        }
#endif
    }